

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSSBOLayoutCase.cpp
# Opt level: O0

TestInstance * __thiscall
vkt::ssbo::SSBOLayoutCase::createInstance(SSBOLayoutCase *this,Context *context)

{
  SSBOLayoutCaseInstance *this_00;
  Context *context_local;
  SSBOLayoutCase *this_local;
  
  this_00 = (SSBOLayoutCaseInstance *)operator_new(0x68);
  SSBOLayoutCaseInstance::SSBOLayoutCaseInstance
            (this_00,context,this->m_bufferMode,&this->m_interface,&this->m_refLayout,
             &this->m_initialData,&this->m_writeData);
  return &this_00->super_TestInstance;
}

Assistant:

TestInstance* SSBOLayoutCase::createInstance (Context& context) const
{
	return new SSBOLayoutCaseInstance(context, m_bufferMode, m_interface, m_refLayout, m_initialData, m_writeData);
}